

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall CoinsViews::CoinsViews(CoinsViews *this,DBParams db_params,CoinsViewOptions options)

{
  long lVar1;
  long in_FS_OFFSET;
  CoinsViewOptions options_00;
  DBParams in_stack_ffffffffffffff98;
  
  options_00._8_8_ = options._8_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DBParams::DBParams((DBParams *)&stack0xffffffffffffffa0,(DBParams *)options.batch_write_bytes);
  options_00.batch_write_bytes = (size_t)&stack0xffffffffffffffa0;
  CCoinsViewDB::CCoinsViewDB(&this->m_dbview,in_stack_ffffffffffffff98,options_00);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffa0);
  CCoinsViewErrorCatcher::CCoinsViewErrorCatcher(&this->m_catcherview,(CCoinsView *)this);
  (this->m_cacheview)._M_t.
  super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
  super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
  super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl = (CCoinsViewCache *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinsViews::CoinsViews(DBParams db_params, CoinsViewOptions options)
    : m_dbview{std::move(db_params), std::move(options)},
      m_catcherview(&m_dbview) {}